

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testConversion.cpp
# Opt level: O1

void anon_unknown.dwarf_b38a6::testHalfToUint(uint halfVal,uint uintVal)

{
  half hVar1;
  uint uVar2;
  ostream *poVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"halfToUint (",0xc);
  hVar1._h = (uint16_t)halfVal;
  poVar3 = (ostream *)::operator<<((ostream *)&std::cout,hVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,") == ",5);
  Imf_3_2::halfToUint(hVar1);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  uVar2 = Imf_3_2::halfToUint(hVar1);
  if (uVar2 == uintVal) {
    return;
  }
  __assert_fail("halfToUint (h) == uintVal",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testConversion.cpp"
                ,0x38,"void (anonymous namespace)::testHalfToUint(unsigned int, unsigned int)");
}

Assistant:

void
testHalfToUint (unsigned int halfVal, unsigned int uintVal)
{
    half h;
    h.setBits (halfVal);
    cout << "halfToUint (" << h << ") == " << halfToUint (h) << endl;
    assert (halfToUint (h) == uintVal);
}